

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.c
# Opt level: O1

MV32 av1_scale_mv(MV *mvq4,int x,int y,scale_factors *sf)

{
  int iVar1;
  long lVar2;
  MV32 MVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  iVar5 = sf->x_scale_fp;
  lVar8 = (long)(iVar5 * 8 + -0x20000);
  lVar2 = (long)iVar5 * (long)(x << 4) + lVar8;
  if (lVar2 < 0) {
    iVar7 = -(int)((ulong)(0x80 - lVar2) >> 8);
  }
  else {
    iVar7 = (int)((ulong)(lVar2 + 0x80) >> 8);
  }
  iVar1 = sf->y_scale_fp;
  lVar2 = (long)(iVar1 * 8 + -0x20000);
  lVar6 = (long)iVar1 * (long)(y << 4) + lVar2;
  if (lVar6 < 0) {
    iVar4 = -(int)((ulong)(0x80 - lVar6) >> 8);
  }
  else {
    iVar4 = (int)((ulong)(lVar6 + 0x80) >> 8);
  }
  lVar2 = ((long)(y << 4) + (long)mvq4->row) * (long)iVar1 + lVar2;
  if (lVar2 < 0) {
    iVar1 = -(int)((ulong)(0x80 - lVar2) >> 8);
  }
  else {
    iVar1 = (int)((ulong)(lVar2 + 0x80) >> 8);
  }
  lVar8 = ((long)(x << 4) + (long)mvq4->col) * (long)iVar5 + lVar8;
  if (lVar8 < 0) {
    iVar5 = -(int)((ulong)(0x80 - lVar8) >> 8);
  }
  else {
    iVar5 = (int)((ulong)(lVar8 + 0x80) >> 8);
  }
  MVar3.row = iVar1 - iVar4;
  MVar3.col = iVar5 - iVar7;
  return MVar3;
}

Assistant:

MV32 av1_scale_mv(const MV *mvq4, int x, int y,
                  const struct scale_factors *sf) {
  const int x_off_q4 = av1_scaled_x(x << SUBPEL_BITS, sf);
  const int y_off_q4 = av1_scaled_y(y << SUBPEL_BITS, sf);
  const MV32 res = {
    av1_scaled_y((y << SUBPEL_BITS) + mvq4->row, sf) - y_off_q4,
    av1_scaled_x((x << SUBPEL_BITS) + mvq4->col, sf) - x_off_q4
  };
  return res;
}